

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::SerializeWithCachedSizes
          (RandomUniformStaticLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  uint64 value;
  int index;
  int iVar2;
  
  if (this->seed_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->seed_,output);
  }
  fVar1 = this->minval_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  }
  fVar1 = this->maxval_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar1,output);
  }
  iVar2 = (this->outputshape_).current_size_;
  if (0 < iVar2) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x22);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_outputshape_cached_byte_size_);
    iVar2 = (this->outputshape_).current_size_;
  }
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
    index = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    value = outputshape(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  return;
}

Assistant:

void RandomUniformStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomUniformStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float minVal = 2;
  if (this->minval() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->minval(), output);
  }

  // float maxVal = 3;
  if (this->maxval() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->maxval(), output);
  }

  // repeated uint64 outputShape = 4;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomUniformStaticLayerParams)
}